

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_namer.h
# Opt level: O3

string * __thiscall
flatbuffers::IdlNamer::EnumVariant_abi_cxx11_
          (string *__return_storage_ptr__,IdlNamer *this,EnumDef *e,EnumVal *v)

{
  size_type *psVar1;
  undefined8 uVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong *local_80;
  long local_78;
  ulong local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  (*(this->super_Namer)._vptr_Namer[0xf])(local_40);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_40,
                              (ulong)(this->super_Namer).config_.enum_variant_seperator._M_dataplus.
                                     _M_p);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_70 = *puVar5;
    uStack_68 = (undefined4)plVar3[3];
    uStack_64 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_80 = &local_70;
  }
  else {
    local_70 = *puVar5;
    local_80 = (ulong *)*plVar3;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  (*(this->super_Namer)._vptr_Namer[0x13])(&local_60,this,v);
  uVar6 = 0xf;
  if (local_80 != &local_70) {
    uVar6 = local_70;
  }
  if (uVar6 < (ulong)(local_58 + local_78)) {
    uVar6 = 0xf;
    if (local_60 != local_50) {
      uVar6 = local_50[0];
    }
    if ((ulong)(local_58 + local_78) <= uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_80);
      goto LAB_001d2a85;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_60);
LAB_001d2a85:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar2 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EnumVariant(const EnumDef &e, const EnumVal &v) const {
    return Type(e) + config_.enum_variant_seperator + Variant(v);
  }